

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O0

void __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setType(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,Type type)

{
  element_type *this_00;
  undefined4 in_ESI;
  long in_RDI;
  double in_stack_000000a0;
  cpp_dec_float<200U,_int,_void> *in_stack_000000a8;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff88;
  cpp_dec_float<200U,_int,_void> *this_01;
  undefined1 local_50 [16];
  Real local_40 [3];
  long local_28;
  long local_20;
  Real *local_18;
  long local_10;
  Real *local_8;
  
  *(undefined4 *)(in_RDI + 0x18) = in_ESI;
  this_01 = (cpp_dec_float<200U,_int,_void> *)local_50;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(in_stack_ffffffffffffff88);
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x78bb27);
  local_40[0] = Tolerances::scaleAccordingToEpsilon(this_00,1e-05);
  local_10 = in_RDI + 0xb0;
  local_18 = local_40;
  local_8 = local_18;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            (in_stack_000000a8,in_stack_000000a0);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x78bb82);
  local_28 = in_RDI + 0x1c;
  local_20 = in_RDI + 0x1b0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (this_01,(cpp_dec_float<200U,_int,_void> *)in_stack_ffffffffffffff88);
  return;
}

Assistant:

void SPxFastRT<R>::setType(typename SPxSolverBase<R>::Type type)
{
   this->m_type = type;

   minStab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_MINSTAB);
   fastDelta = this->delta;
}